

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safeint-test.cc
# Opt level: O0

void __thiscall SafeIntTest_MulOverflow_Test::TestBody(SafeIntTest_MulOverflow_Test *this)

{
  bool bVar1;
  OverflowError *anon_var_0_4;
  bool gtest_caught_expected_4;
  ConstCharPtr gtest_msg_4;
  OverflowError *anon_var_0_3;
  bool gtest_caught_expected_3;
  ConstCharPtr gtest_msg_3;
  OverflowError *anon_var_0_2;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  OverflowError *anon_var_0_1;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  OverflowError *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  int in_stack_fffffffffffffecc;
  SafeInt<int> in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  SafeInt<int> in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffeec;
  SafeInt<int> in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef4;
  Type in_stack_fffffffffffffefc;
  AssertHelper *in_stack_ffffffffffffff00;
  SafeInt<int> local_e8;
  byte local_e1;
  ConstCharPtr local_e0 [4];
  int local_bc;
  undefined7 in_stack_ffffffffffffff48;
  byte in_stack_ffffffffffffff4f;
  char *in_stack_ffffffffffffff50;
  SafeInt<int> local_88;
  byte local_81;
  ConstCharPtr local_80 [4];
  int local_5c;
  SafeInt<int> local_58;
  byte local_51;
  ConstCharPtr local_50 [4];
  int local_2c;
  SafeInt<int> local_28 [5];
  byte local_11;
  ConstCharPtr local_10 [2];
  
  testing::internal::ConstCharPtr::ConstCharPtr(local_10,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_10);
  if (bVar1) {
    local_11 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffef4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffef4);
    if (bVar1) {
      mp::SafeInt<int>::SafeInt(local_28,-0x80000000);
      in_stack_fffffffffffffef0 = mp::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
      ;
      local_2c = in_stack_fffffffffffffef0.value_;
    }
    if ((local_11 & 1) == 0) {
      local_10[0].value =
           "Expected: SafeInt<int>((-2147483647 -1)) * -1 throws an exception of type OverflowError.\n  Actual: it throws nothing."
      ;
      goto LAB_0010dd6c;
    }
  }
  else {
LAB_0010dd6c:
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
               in_stack_fffffffffffffeec,
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.value_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50,
               (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.value_))
    ;
    testing::Message::~Message((Message *)0x10ddd2);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(local_50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_50);
  if (bVar1) {
    local_51 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffeec = CONCAT13(bVar1,(int3)in_stack_fffffffffffffeec);
    if (bVar1) {
      mp::SafeInt<int>::SafeInt(&local_58,0x3fffffff);
      local_5c = (int)mp::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    }
    if ((local_51 & 1) == 0) {
      local_50[0].value =
           "Expected: SafeInt<int>(2147483647 / 2) * 3 throws an exception of type OverflowError.\n  Actual: it throws nothing."
      ;
      goto LAB_0010df3a;
    }
  }
  else {
LAB_0010df3a:
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
               in_stack_fffffffffffffeec,
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.value_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50,
               (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.value_))
    ;
    testing::Message::~Message((Message *)0x10dfa0);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(local_80,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_80);
  if (bVar1) {
    local_81 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffee4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffee4);
    if (bVar1) {
      mp::SafeInt<int>::SafeInt(&local_88,0x65);
      in_stack_fffffffffffffee0 = mp::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
      ;
    }
    if ((local_81 & 1) == 0) {
      local_80[0].value =
           "Expected: SafeInt<int>(101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
      ;
      goto LAB_0010e108;
    }
  }
  else {
LAB_0010e108:
    testing::Message::Message((Message *)in_stack_ffffffffffffff00);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
               (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
               in_stack_fffffffffffffeec,
               (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.value_));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffff50,
               (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.value_))
    ;
    testing::Message::~Message((Message *)0x10e16e);
  }
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffff50,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffff50);
  if (bVar1) {
    in_stack_ffffffffffffff4f = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::SafeInt<int>::SafeInt((SafeInt<int> *)&stack0xffffffffffffff48,-0x65);
      local_bc = (int)mp::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    }
    if ((in_stack_ffffffffffffff4f & 1) != 0) goto LAB_0010e369;
    in_stack_ffffffffffffff50 =
         "Expected: SafeInt<int>(-101) * (2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff00);
  testing::internal::AssertHelper::AssertHelper
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
             in_stack_fffffffffffffeec,
             (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.value_));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff50,
             (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.value_));
  testing::Message::~Message((Message *)0x10e324);
LAB_0010e369:
  testing::internal::ConstCharPtr::ConstCharPtr(local_e0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(local_e0);
  if (bVar1) {
    local_e1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffed4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed4);
    if (bVar1) {
      mp::SafeInt<int>::SafeInt(&local_e8,0x65);
      in_stack_fffffffffffffed0 = mp::operator*(in_stack_fffffffffffffed0,in_stack_fffffffffffffecc)
      ;
    }
    if ((local_e1 & 1) != 0) {
      return;
    }
    local_e0[0].value =
         "Expected: SafeInt<int>(101) * -(2147483647 / 100) throws an exception of type OverflowError.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff00);
  testing::internal::AssertHelper::AssertHelper
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,
             (char *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0.value_),
             in_stack_fffffffffffffeec,
             (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0.value_));
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_ffffffffffffff50,
             (Message *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48));
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0.value_));
  testing::Message::~Message((Message *)0x10e4b6);
  return;
}

Assistant:

TEST(SafeIntTest, MulOverflow) {
  EXPECT_THROW(SafeInt<int>(INT_MIN) * -1, OverflowError);
  EXPECT_THROW(SafeInt<int>(INT_MAX / 2) * 3, OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(-101) * (INT_MAX / 100), OverflowError);
  EXPECT_THROW(SafeInt<int>(101) * -(INT_MAX / 100), OverflowError);
}